

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufWriteQuotedString(xmlBufPtr buf,xmlChar *string)

{
  int iVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = -1;
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar3 = (ulong)buf->compat_size;
    if ((uVar3 < 0x7fffffff) && (buf->size != uVar3)) {
      buf->size = uVar3;
    }
    uVar3 = (ulong)buf->compat_use;
    if ((uVar3 < 0x7fffffff) && (buf->use != uVar3)) {
      buf->use = uVar3;
    }
    if (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
      pxVar2 = xmlStrchr(string,'\"');
      if (pxVar2 == (xmlChar *)0x0) {
        pxVar2 = "\"";
      }
      else {
        pxVar2 = xmlStrchr(string,'\'');
        if (pxVar2 != (xmlChar *)0x0) {
          pxVar2 = "\"";
          xmlBufCat(buf,"\"");
          do {
            lVar4 = 0;
            while( true ) {
              if (string[lVar4] == '\0') {
                if (lVar4 != 0) {
                  xmlBufAdd(buf,string,(int)lVar4);
                }
                goto LAB_00136e00;
              }
              if (string[lVar4] == '\"') break;
              lVar4 = lVar4 + 1;
            }
            if (lVar4 != 0) {
              xmlBufAdd(buf,string,(int)lVar4);
            }
            xmlBufAdd(buf,(xmlChar *)"&quot;",6);
            string = string + lVar4 + 1;
          } while( true );
        }
        pxVar2 = "\'";
      }
      xmlBufCat(buf,pxVar2);
      xmlBufCat(buf,string);
LAB_00136e00:
      xmlBufCat(buf,pxVar2);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlBufWriteQuotedString(xmlBufPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(-1);
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
#ifdef DEBUG_BUFFER
	    xmlGenericError(xmlGenericErrorContext,
 "xmlBufWriteQuotedString: string contains quote and double-quotes !\n");
#endif
	    xmlBufCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufAdd(buf, base, cur - base);
                    xmlBufAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
	    xmlBufCCat(buf, "\"");
	}
        else{
	    xmlBufCCat(buf, "\'");
            xmlBufCat(buf, string);
	    xmlBufCCat(buf, "\'");
        }
    } else {
        xmlBufCCat(buf, "\"");
        xmlBufCat(buf, string);
        xmlBufCCat(buf, "\"");
    }
    return(0);
}